

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O2

bool __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryClonePrimitive
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Src src,Dst *dst)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar1;
  bool bVar2;
  double in_RAX;
  Engine *this_00;
  JavascriptBoolean *pJVar3;
  double local_28;
  scaposition_t pos;
  
  bVar2 = false;
  if (10 < (int)typeId) {
    return false;
  }
  if (SCA_LastPrimitive < typeId) {
    return false;
  }
  scriptContext =
       (this->
       super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
       ).super_ScriptContextHolder.m_scriptContext;
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  local_28 = in_RAX;
  switch(typeId) {
  case SCA_None:
    *dst = (Dst)0x0;
    goto LAB_00d5c02e;
  case SCA_Reference:
    StreamReader::Read<unsigned_int>(this->m_reader,(uint *)&local_28);
    this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
              ::GetEngine(&this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                         );
    bVar2 = SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::
            TryGetClonedObject(this_00,local_28._0_4_,dst);
    if (!bVar2) {
      ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
    }
    goto LAB_00d5c02e;
  case SCA_NullValue:
    pJVar3 = (JavascriptBoolean *)(pJVar1->super_JavascriptLibraryBase).nullValue.ptr;
    break;
  case SCA_UndefinedValue:
    pJVar3 = (JavascriptBoolean *)(pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    break;
  case SCA_TrueValue:
    pJVar3 = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
    break;
  case SCA_FalseValue:
    pJVar3 = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
    break;
  case SCA_Int32Value:
    StreamReader::Read<int>(this->m_reader,(int *)&local_28);
    pJVar3 = (JavascriptBoolean *)((ulong)local_28 & 0xffffffff | 0x1000000000000);
    break;
  case SCA_DoubleValue:
    StreamReader::Read<double>(this->m_reader,&local_28);
    pJVar3 = (JavascriptBoolean *)JavascriptNumber::ToVarWithCheck(local_28,scriptContext);
    break;
  case SCA_StringValue:
    goto switchD_00d5bf4f_caseD_8;
  case SCA_Int64Value:
    StreamReader::Read<long>(this->m_reader,(long *)&local_28);
    pJVar3 = (JavascriptBoolean *)JavascriptTypedNumber<long>::ToVar((long)local_28,scriptContext);
    break;
  case SCA_LastPrimitive:
    StreamReader::Read<unsigned_long>(this->m_reader,(unsigned_long *)&local_28);
    pJVar3 = (JavascriptBoolean *)
             JavascriptTypedNumber<unsigned_long>::ToVar((unsigned_long)local_28,scriptContext);
  }
  *dst = pJVar3;
LAB_00d5c02e:
  bVar2 = true;
switchD_00d5bf4f_caseD_8:
  return bVar2;
}

Assistant:

bool DeserializationCloner<Reader>::TryClonePrimitive(SrcTypeId typeId, Src src, Dst* dst)
    {
        if (!IsSCAPrimitive(typeId))
        {
            return false;
        }

        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptLibrary* lib = scriptContext->GetLibrary();

        switch (typeId)
        {
        case SCA_None:
            *dst = NULL;
            break;

        case SCA_Reference: // Handle reference explictly as a primitive
            {
                scaposition_t pos;
                m_reader->Read(&pos);
                if (!this->GetEngine()->TryGetClonedObject(pos, dst))
                {
                    this->ThrowSCADataCorrupt();
                }
            }
            break;

        case SCA_NullValue:
            *dst = lib->GetNull();
            break;

        case SCA_UndefinedValue:
            *dst = lib->GetUndefined();
            break;

        case SCA_TrueValue:
            *dst = lib->GetTrue();
            break;

        case SCA_FalseValue:
            *dst = lib->GetFalse();
            break;

        case SCA_Int32Value:
            {
                int32 n;
                m_reader->Read(&n);
                *dst = JavascriptNumber::ToVar(n, scriptContext);
            }
            break;

        case SCA_DoubleValue:
            {
                double dbl;
                m_reader->Read(&dbl);
                *dst = JavascriptNumber::ToVarWithCheck(dbl, scriptContext);
            }
            break;

        case SCA_Int64Value:
            {
                __int64 n;
                m_reader->Read(&n);
                *dst = JavascriptInt64Number::ToVar(n, scriptContext);
            }
            break;

        case SCA_Uint64Value:
            {
                unsigned __int64 n;
                m_reader->Read(&n);
                *dst = JavascriptUInt64Number::ToVar(n, scriptContext);
            }
            break;

        default:
            return false; // Not a recognized primitive type
        }

        return true;
    }